

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::putDown(Projection *this,
                   Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
                   FArrayBox *phi_fine_strip,int c_lev,int f_lev,Orientation *outFaces,
                   int numOutFlowFaces,int ncStripWidth)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  Geometry *this_00;
  IntVect *pIVar8;
  MultiFab **ppMVar9;
  int in_ECX;
  long in_RDX;
  int in_R8D;
  long in_R9;
  IntVect IVar10;
  int in_stack_00000008;
  int in_stack_00000010;
  Array4<double> *phi_c_arr;
  Box result;
  Box ovlp;
  MFIter mfi;
  Array4<double> *phi_f_arr;
  MultiFab phi_crse_strip;
  DistributionMapping dm;
  BoxArray ba;
  Box phiC_strip;
  int iface;
  Box *domainC;
  int lev;
  IntVect ratio;
  int nGrow;
  int nCompPhi;
  IndexType typ;
  int bg;
  uint bitval;
  int sm;
  IntVect hi;
  IntVect low;
  int dir;
  int i;
  int dir_1;
  IntVect off;
  Box *in_stack_fffffffffffff618;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff628;
  int in_stack_fffffffffffff62c;
  int in_stack_fffffffffffff630;
  int in_stack_fffffffffffff634;
  int in_stack_fffffffffffff638;
  CpOp in_stack_fffffffffffff63c;
  CpOp in_stack_fffffffffffff640;
  CpOp in_stack_fffffffffffff644;
  int in_stack_fffffffffffff648;
  int in_stack_fffffffffffff64c;
  int in_stack_fffffffffffff650;
  int in_stack_fffffffffffff654;
  BoxArray *in_stack_fffffffffffff658;
  int in_stack_fffffffffffff660;
  int in_stack_fffffffffffff664;
  int in_stack_fffffffffffff668;
  int in_stack_fffffffffffff66c;
  int in_stack_fffffffffffff670;
  int in_stack_fffffffffffff674;
  int local_988;
  int local_984;
  int local_97c;
  int local_978;
  int local_974;
  int local_964;
  int local_960;
  int local_95c;
  int local_954;
  int local_950;
  int local_94c;
  int local_944;
  int local_940;
  int local_93c;
  undefined1 local_8d8 [64];
  undefined1 auStack_898 [64];
  int local_858 [2];
  int local_850;
  undefined1 local_848 [64];
  undefined1 *local_808;
  undefined8 local_7e0;
  undefined1 local_7d8 [8];
  undefined8 local_7d0;
  uint local_7c8;
  Box local_7c4;
  MFIter local_7a8;
  Array4<double> local_748;
  Array4<double> *local_708;
  undefined1 local_700 [32];
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  int local_4c0;
  Box local_4bc;
  Box local_4a0;
  int local_484;
  Box *local_480;
  int local_478 [3];
  undefined8 local_468;
  int local_460;
  int local_45c;
  int local_458 [2];
  int local_450;
  int local_444;
  int iStack_440;
  int local_43c;
  undefined4 local_438;
  undefined4 local_434;
  long local_430;
  int local_428;
  int local_424;
  long local_420;
  Box *local_408;
  long local_400;
  int local_3f8 [2];
  int local_3f0;
  IntVect local_3e4;
  undefined8 *local_3d8;
  int *local_3d0;
  uint local_3c4;
  uint local_3c0;
  int local_3bc;
  int local_3b8 [3];
  undefined8 local_3a4;
  int local_39c;
  uint local_398;
  int local_394;
  IntVect local_390;
  IntVect local_384;
  int local_378;
  int local_374;
  Box *local_370;
  Orientation local_364;
  int *local_360;
  Box *local_358;
  undefined4 local_34c;
  undefined8 *local_348;
  undefined4 local_33c;
  undefined8 *local_338;
  undefined4 local_32c;
  undefined8 *local_328;
  int local_31c;
  Box *local_318;
  int local_30c;
  IndexType *local_308;
  undefined4 local_300;
  int local_2fc;
  IntVect *local_2f8;
  IndexType *local_2f0;
  int local_2e4;
  IndexType *local_2e0;
  int local_2d8;
  int local_2d4;
  uint *local_2d0;
  int local_2c8;
  int local_2c4;
  IntVect *local_2c0;
  int local_2b4;
  IntVect *local_2b0;
  int local_2a4;
  undefined8 *local_2a0;
  int local_298;
  int local_294;
  IntVect *local_290;
  int local_288;
  int local_284;
  IntVect *local_280;
  int local_278;
  int local_274;
  IntVect *local_270;
  int local_268;
  int local_264;
  IntVect *local_260;
  int local_258;
  IntVect local_254;
  int *local_248;
  undefined8 *local_240;
  int local_234;
  int *local_230;
  int local_224;
  uint *local_220;
  int local_214;
  uint *local_210;
  int local_208;
  undefined4 local_204;
  int *local_200;
  IntVect *local_1f8;
  undefined1 *local_1f0;
  undefined4 local_1e4;
  IntVect *local_1e0;
  undefined4 local_1d4;
  IntVect *local_1d0;
  undefined4 local_1c4;
  IntVect *local_1c0;
  int local_1b4;
  undefined1 *local_1b0;
  int *local_1a8;
  BoxArray *local_1a0;
  int *local_198;
  undefined1 *local_190;
  int *local_188;
  undefined8 *local_180;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  CpOp local_11c;
  CpOp local_118;
  int local_114;
  int local_110;
  int local_10c;
  undefined4 local_108;
  int local_104;
  IntVect *local_100;
  uint *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_434 = 1;
  local_438 = 0;
  local_430 = in_R9;
  local_428 = in_R8D;
  local_424 = in_ECX;
  local_420 = in_RDX;
  amrex::IntVect::IntVect(&local_3e4,1);
  local_3f0 = local_3e4.vect[2];
  local_3f8[0] = local_3e4.vect[0];
  local_3f8[1] = local_3e4.vect[1];
  local_450 = local_3e4.vect[2];
  local_458[0] = local_3e4.vect[0];
  local_458[1] = local_3e4.vect[1];
  local_444 = local_3e4.vect[0];
  iStack_440 = local_3e4.vect[1];
  local_43c = local_3e4.vect[2];
  while (local_45c = local_428 + -1, local_424 <= local_45c) {
    IVar10 = amrex::AmrMesh::refRatio
                       ((AmrMesh *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                        in_stack_fffffffffffff62c);
    local_478._0_8_ = IVar10.vect._0_8_;
    local_468._0_4_ = local_478[0];
    local_468._4_4_ = local_478[1];
    uVar5 = local_468;
    local_478[2] = IVar10.vect[2];
    local_460 = local_478[2];
    local_3d0 = &local_444;
    local_3d8 = &local_468;
    local_32c = 0;
    local_468._0_4_ = IVar10.vect[0];
    iVar7 = iStack_440;
    local_444 = (int)local_468 * local_444;
    local_33c = 1;
    local_468._4_4_ = IVar10.vect[1];
    iStack_440 = local_468._4_4_ * iVar7;
    local_34c = 2;
    local_43c = local_478[2] * local_43c;
    local_478 = IVar10.vect;
    local_468 = uVar5;
    local_348 = local_3d8;
    local_338 = local_3d8;
    local_328 = local_3d8;
    this_00 = amrex::AmrMesh::Geom
                        ((AmrMesh *)in_stack_fffffffffffff620,
                         (int)((ulong)in_stack_fffffffffffff618 >> 0x20));
    local_480 = amrex::Geometry::Domain(this_00);
    for (local_484 = 0; local_428 = local_45c, local_484 < in_stack_00000008;
        local_484 = local_484 + 1) {
      local_4c0 = *(int *)(local_430 + (long)local_484 * 4);
      local_370 = local_480;
      local_374 = in_stack_00000010;
      local_364.val = local_4c0;
      local_378 = amrex::Orientation::coordDir(&local_364);
      pIVar8 = amrex::Box::smallEnd(local_370);
      local_384.vect._0_8_ = *(undefined8 *)pIVar8->vect;
      local_384.vect[2] = pIVar8->vect[2];
      pIVar8 = amrex::Box::bigEnd(local_370);
      local_390.vect._0_8_ = *(undefined8 *)pIVar8->vect;
      local_390.vect[2] = pIVar8->vect[2];
      bVar6 = amrex::Orientation::isLow(&local_364);
      if (bVar6) {
        local_2c4 = local_378;
        local_394 = local_384.vect[local_378];
        iVar7 = (local_394 - local_374) + 1;
        local_284 = local_378;
        local_384.vect[local_378] = iVar7;
        local_294 = local_378;
        local_390.vect[local_378] = local_394;
        local_2c0 = &local_384;
        local_298 = local_394;
        local_290 = &local_390;
        local_288 = iVar7;
        local_280 = &local_384;
      }
      else {
        IVar10 = amrex::Box::type((Box *)CONCAT44(in_stack_fffffffffffff63c,
                                                  in_stack_fffffffffffff638));
        local_3b8._0_8_ = IVar10.vect._0_8_;
        local_3a4._0_4_ = local_3b8[0];
        local_3a4._4_4_ = local_3b8[1];
        local_3b8[2] = IVar10.vect[2];
        local_39c = local_3b8[2];
        local_2a4 = local_378;
        local_398 = *(uint *)((long)&local_3a4 + (long)local_378 * 4);
        local_2b4 = local_378;
        local_3bc = (local_390.vect[local_378] + 1) - (local_398 & 1);
        local_264 = local_378;
        local_384.vect[local_378] = local_3bc;
        iVar7 = local_3bc + local_374 + -1;
        local_274 = local_378;
        local_390.vect[local_378] = iVar7;
        local_3b8 = IVar10.vect;
        local_2b0 = &local_390;
        local_2a0 = &local_3a4;
        local_278 = iVar7;
        local_270 = &local_390;
        local_268 = local_3bc;
        local_260 = &local_384;
      }
      local_3c4 = (uint)amrex::Box::ixType(local_370);
      local_2d0 = &local_3c0;
      local_2d4 = local_378;
      local_2c8 = local_378;
      local_3c4 = 1 << ((byte)local_378 & 0x1f) | local_3c4;
      local_3c0 = local_3c4;
      amrex::Box::Box(&local_4bc,&local_384,&local_390,(IndexType)local_3c4);
      local_408 = &local_4bc;
      local_318 = &local_4a0;
      for (local_31c = 0; local_31c < 3; local_31c = local_31c + 1) {
        local_308 = &local_4a0.btype;
        local_30c = local_31c;
        local_2e4 = local_31c;
        local_2d8 = local_31c;
        if ((local_4bc.btype.itype & 1 << ((byte)local_31c & 0x1f)) == 0) {
          local_2f8 = &local_4a0.bigend;
          local_2fc = local_31c;
          local_300 = 1;
          local_2f8->vect[local_31c] = local_2f8->vect[local_31c] + 1;
        }
        local_2e0 = local_308;
      }
      local_2f0 = &local_4a0.btype;
      amrex::Box::grow(&local_4a0,0);
      amrex::BoxArray::BoxArray
                ((BoxArray *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                 (Box *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
      amrex::BoxArray::maxSize
                ((BoxArray *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                 in_stack_fffffffffffff62c);
      amrex::ParallelDescriptor::NProcs();
      amrex::DistributionMapping::DistributionMapping
                ((DistributionMapping *)
                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 (BoxArray *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                 in_stack_fffffffffffff634);
      local_700._24_8_ = 0;
      uStack_6e0 = 0;
      local_700._8_4_ = 0;
      local_700._12_4_ = 0;
      local_700._16_4_ = 0;
      local_700._20_4_ = 0;
      local_6d8 = 0;
      amrex::MFInfo::MFInfo((MFInfo *)0x596625);
      local_700._0_4_ = 0;
      local_700._4_4_ = 0;
      in_stack_fffffffffffff618 = (Box *)local_700;
      amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff620);
      amrex::MultiFab::MultiFab
                ((MultiFab *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                 in_stack_fffffffffffff658,
                 (DistributionMapping *)
                 CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                 in_stack_fffffffffffff64c,in_stack_fffffffffffff648,
                 (MFInfo *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 (FabFactory<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
      amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x596690);
      amrex::MFInfo::~MFInfo((MFInfo *)0x59669d);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff620,(value_type)in_stack_fffffffffffff618);
      local_400 = local_420 + (long)local_484 * 0x48;
      local_a8 = *(double **)(local_400 + 0x10);
      local_b0 = (undefined8 *)(local_400 + 0x18);
      local_b4 = *(int *)(local_400 + 0x34);
      local_5c = 0;
      local_88 = *(undefined4 *)local_b0;
      local_6c = 1;
      uStack_84 = *(undefined4 *)(local_400 + 0x1c);
      local_d0._0_8_ = *local_b0;
      local_7c = 2;
      local_d0.z = *(int *)(local_400 + 0x20);
      local_8 = (int *)(local_400 + 0x24);
      local_c = 0;
      local_38 = *local_8 + 1;
      local_18 = local_400 + 0x24;
      local_1c = 1;
      iStack_34 = *(int *)(local_400 + 0x28) + 1;
      local_28 = local_400 + 0x24;
      local_2c = 2;
      local_f0.z = *(int *)(local_400 + 0x2c) + 1;
      local_f0.y = iStack_34;
      local_f0.x = local_38;
      local_e0._0_8_ = local_f0._0_8_;
      local_e0.z = local_f0.z;
      local_c0._0_8_ = local_d0._0_8_;
      local_c0.z = local_d0.z;
      local_a0._0_8_ = local_d0._0_8_;
      local_a0.z = local_d0.z;
      local_90 = local_b0;
      local_80 = local_d0.z;
      local_78 = local_b0;
      local_68 = local_b0;
      local_58 = local_b0;
      local_50._0_8_ = local_f0._0_8_;
      local_50.z = local_f0.z;
      local_40 = local_b0;
      local_30 = local_f0.z;
      amrex::Array4<double>::Array4(&local_748,local_a8,&local_c0,&local_e0,local_b4);
      local_708 = &local_748;
      amrex::MFIter::MFIter
                ((MFIter *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                 (uchar)(in_stack_fffffffffffff644 >> 0x18));
      while (bVar6 = amrex::MFIter::isValid(&local_7a8), bVar6) {
        local_358 = amrex::BaseFab<double>::box
                              ((BaseFab<double> *)(local_420 + (long)local_484 * 0x48));
        lVar4 = local_7d0;
        local_360 = &local_444;
        lVar1 = *(long *)(local_358->smallend).vect;
        lVar2 = *(long *)((local_358->smallend).vect + 2);
        local_7d0 = *(long *)((local_358->bigend).vect + 1);
        local_7c8 = (local_358->btype).itype;
        local_240 = &local_7e0;
        local_204 = 1;
        bVar6 = true;
        if ((local_444 == 1) && (bVar6 = true, iStack_440 == 1)) {
          bVar6 = local_43c != 1;
        }
        local_7e0 = lVar1;
        local_7d8 = (undefined1  [8])lVar2;
        local_248 = local_360;
        local_200 = local_360;
        if (bVar6) {
          local_7e0._0_4_ = (int)lVar1;
          local_158 = (int)local_7e0;
          local_15c = local_444;
          local_154 = local_158;
          if (local_444 != 1) {
            if (local_444 == 2) {
              if ((int)local_7e0 < 0) {
                iVar7 = (int)local_7e0 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_93c = -iVar7 / 2 + -1;
              }
              else {
                local_93c = (int)local_7e0 / 2;
              }
              local_154 = local_93c;
            }
            else if (local_444 == 4) {
              if ((int)local_7e0 < 0) {
                iVar7 = (int)local_7e0 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_940 = -iVar7 / 4 + -1;
              }
              else {
                local_940 = (int)local_7e0 / 4;
              }
              local_154 = local_940;
            }
            else {
              if ((int)local_7e0 < 0) {
                iVar7 = (int)local_7e0 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_944 = -iVar7 / local_444 + -1;
              }
              else {
                local_944 = (int)local_7e0 / local_444;
              }
              local_154 = local_944;
            }
          }
          local_7e0._4_4_ = (int)((ulong)lVar1 >> 0x20);
          local_164 = local_7e0._4_4_;
          local_7e0._0_4_ = local_154;
          local_168 = iStack_440;
          local_160 = local_164;
          if (iStack_440 != 1) {
            if (iStack_440 == 2) {
              if (lVar1 < 0) {
                iVar7 = local_164 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_94c = -iVar7 / 2 + -1;
              }
              else {
                local_94c = local_164 / 2;
              }
              local_160 = local_94c;
            }
            else if (iStack_440 == 4) {
              if (lVar1 < 0) {
                iVar7 = local_164 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_950 = -iVar7 / 4 + -1;
              }
              else {
                local_950 = local_164 / 4;
              }
              local_160 = local_950;
            }
            else {
              if (lVar1 < 0) {
                iVar7 = local_164 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_954 = -iVar7 / iStack_440 + -1;
              }
              else {
                local_954 = local_164 / iStack_440;
              }
              local_160 = local_954;
            }
          }
          local_7e0._4_4_ = local_160;
          local_7d8._0_4_ = (undefined4)lVar2;
          local_170 = local_7d8._0_4_;
          local_174 = local_43c;
          local_16c = local_170;
          if (local_43c != 1) {
            if (local_43c == 2) {
              if ((int)local_7d8._0_4_ < 0) {
                iVar7 = local_7d8._0_4_ + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_95c = -iVar7 / 2 + -1;
              }
              else {
                local_95c = (int)local_7d8._0_4_ / 2;
              }
              local_16c = local_95c;
            }
            else if (local_43c == 4) {
              if ((int)local_7d8._0_4_ < 0) {
                iVar7 = local_7d8._0_4_ + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_960 = -iVar7 / 4 + -1;
              }
              else {
                local_960 = (int)local_7d8._0_4_ / 4;
              }
              local_16c = local_960;
            }
            else {
              if ((int)local_7d8._0_4_ < 0) {
                iVar7 = local_7d8._0_4_ + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_964 = -iVar7 / local_43c + -1;
              }
              else {
                local_964 = (int)local_7d8._0_4_ / local_43c;
              }
              local_16c = local_964;
            }
          }
          local_7d8._4_4_ = (undefined4)((ulong)lVar2 >> 0x20);
          uVar3 = local_7d8._4_4_;
          local_7d8._0_4_ = local_16c;
          local_f8 = &local_7c8;
          local_188 = local_360;
          local_180 = local_240;
          if (local_7c8 == 0) {
            in_stack_fffffffffffff658 = (BoxArray *)(local_7d8 + 4);
            local_110 = uVar3;
            local_114 = local_444;
            local_10c = local_110;
            if (local_444 != 1) {
              if (local_444 == 2) {
                if (lVar2 < 0) {
                  iVar7 = uVar3 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  in_stack_fffffffffffff654 = -iVar7 / 2 + -1;
                  local_10c = in_stack_fffffffffffff654;
                }
                else {
                  in_stack_fffffffffffff654 = (int)uVar3 / 2;
                  local_10c = in_stack_fffffffffffff654;
                }
              }
              else if (local_444 == 4) {
                if (lVar2 < 0) {
                  iVar7 = uVar3 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  in_stack_fffffffffffff650 = -iVar7 / 4 + -1;
                  local_10c = in_stack_fffffffffffff650;
                }
                else {
                  in_stack_fffffffffffff650 = (int)uVar3 / 4;
                  local_10c = in_stack_fffffffffffff650;
                }
              }
              else if (lVar2 < 0) {
                iVar7 = uVar3 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                in_stack_fffffffffffff64c = -iVar7 / local_444 + -1;
                local_10c = in_stack_fffffffffffff64c;
              }
              else {
                in_stack_fffffffffffff64c = (int)uVar3 / local_444;
                local_10c = in_stack_fffffffffffff64c;
              }
            }
            local_7d8._4_4_ = local_10c;
            local_11c = (CpOp)local_7d0;
            local_120 = iStack_440;
            local_118 = local_11c;
            if (iStack_440 != 1) {
              if (iStack_440 == 2) {
                if ((int)(CpOp)local_7d0 < 0) {
                  iVar7 = (CpOp)local_7d0 + ADD;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  in_stack_fffffffffffff644 = -iVar7 / 2 - ADD;
                  local_118 = in_stack_fffffffffffff644;
                }
                else {
                  in_stack_fffffffffffff644 = (int)(CpOp)local_7d0 / 2;
                  local_118 = in_stack_fffffffffffff644;
                }
              }
              else if (iStack_440 == 4) {
                if ((int)(CpOp)local_7d0 < 0) {
                  iVar7 = (CpOp)local_7d0 + ADD;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  in_stack_fffffffffffff640 = -iVar7 / 4 - ADD;
                  local_118 = in_stack_fffffffffffff640;
                }
                else {
                  in_stack_fffffffffffff640 = (int)(CpOp)local_7d0 / 4;
                  local_118 = in_stack_fffffffffffff640;
                }
              }
              else if ((int)(CpOp)local_7d0 < 0) {
                iVar7 = (CpOp)local_7d0 + ADD;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                in_stack_fffffffffffff63c = -iVar7 / iStack_440 - ADD;
                local_118 = in_stack_fffffffffffff63c;
              }
              else {
                in_stack_fffffffffffff63c = (int)(CpOp)local_7d0 / iStack_440;
                local_118 = in_stack_fffffffffffff63c;
              }
            }
            local_7d0._4_4_ = SUB84(lVar4,4);
            local_128 = local_7d0._4_4_;
            local_7d0._0_4_ = local_118;
            local_12c = local_43c;
            local_124 = local_128;
            if (local_43c != 1) {
              if (local_43c == 2) {
                if (lVar4 < 0) {
                  iVar7 = local_128 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  in_stack_fffffffffffff634 = -iVar7 / 2 + -1;
                  local_124 = in_stack_fffffffffffff634;
                }
                else {
                  in_stack_fffffffffffff634 = local_128 / 2;
                  local_124 = in_stack_fffffffffffff634;
                }
              }
              else if (local_43c == 4) {
                if (lVar4 < 0) {
                  iVar7 = local_128 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  in_stack_fffffffffffff630 = -iVar7 / 4 + -1;
                  local_124 = in_stack_fffffffffffff630;
                }
                else {
                  in_stack_fffffffffffff630 = local_128 / 4;
                  local_124 = in_stack_fffffffffffff630;
                }
              }
              else if (lVar4 < 0) {
                iVar7 = local_128 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                in_stack_fffffffffffff62c = -iVar7 / local_43c + -1;
                local_124 = in_stack_fffffffffffff62c;
              }
              else {
                in_stack_fffffffffffff62c = local_128 / local_43c;
                local_124 = in_stack_fffffffffffff62c;
              }
            }
            local_7d0._4_4_ = local_124;
            in_stack_fffffffffffff638 = local_43c;
            in_stack_fffffffffffff648 = iStack_440;
            in_stack_fffffffffffff660 = local_444;
            local_7d8 = local_7d8;
            local_7d0 = local_7d0;
            local_1a8 = local_360;
            local_1a0 = in_stack_fffffffffffff658;
          }
          else {
            amrex::IntVect::IntVect(&local_254,0);
            lVar1 = local_7d0;
            for (local_258 = 0; local_258 < 3; local_258 = local_258 + 1) {
              local_220 = &local_7c8;
              local_224 = local_258;
              local_214 = local_258;
              local_208 = local_258;
              if ((local_7c8 & 1 << ((byte)local_258 & 0x1f)) != 0) {
                local_1b0 = local_7d8 + 4;
                local_1b4 = local_258;
                local_230 = local_248;
                local_234 = local_258;
                if (*(int *)(local_1b0 + (long)local_258 * 4) % local_248[local_258] != 0) {
                  local_100 = &local_254;
                  local_104 = local_258;
                  local_108 = 1;
                  local_100->vect[local_258] = 1;
                }
              }
              local_210 = local_220;
            }
            local_190 = local_7d8 + 4;
            local_198 = local_248;
            local_134 = local_7d8._4_4_;
            local_138 = *local_248;
            local_130 = local_134;
            if (local_138 != 1) {
              if (local_138 == 2) {
                if ((long)local_7d8 < 0) {
                  iVar7 = local_7d8._4_4_ + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_974 = -iVar7 / 2 + -1;
                }
                else {
                  local_974 = (int)local_7d8._4_4_ / 2;
                }
                local_130 = local_974;
              }
              else if (local_138 == 4) {
                if ((long)local_7d8 < 0) {
                  iVar7 = local_7d8._4_4_ + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_978 = -iVar7 / 4 + -1;
                }
                else {
                  local_978 = (int)local_7d8._4_4_ / 4;
                }
                local_130 = local_978;
              }
              else {
                if ((long)local_7d8 < 0) {
                  iVar7 = local_7d8._4_4_ + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_97c = -iVar7 / local_138 + -1;
                }
                else {
                  local_97c = (int)local_7d8._4_4_ / local_138;
                }
                local_130 = local_97c;
              }
            }
            local_7d8._4_4_ = local_130;
            local_140 = (CpOp)local_7d0;
            local_144 = local_248[1];
            local_13c = local_140;
            if (local_144 != 1) {
              if (local_144 == 2) {
                if ((int)(CpOp)local_7d0 < 0) {
                  iVar7 = (CpOp)local_7d0 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_984 = -iVar7 / 2 + -1;
                }
                else {
                  local_984 = (int)(CpOp)local_7d0 / 2;
                }
                local_13c = local_984;
              }
              else if (local_144 == 4) {
                if ((int)(CpOp)local_7d0 < 0) {
                  iVar7 = (CpOp)local_7d0 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_988 = -iVar7 / 4 + -1;
                }
                else {
                  local_988 = (int)(CpOp)local_7d0 / 4;
                }
                local_13c = local_988;
              }
              else if ((int)(CpOp)local_7d0 < 0) {
                iVar7 = (CpOp)local_7d0 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                in_stack_fffffffffffff674 = -iVar7 / local_144 + -1;
                local_13c = in_stack_fffffffffffff674;
              }
              else {
                in_stack_fffffffffffff674 = (int)(CpOp)local_7d0 / local_144;
                local_13c = in_stack_fffffffffffff674;
              }
            }
            local_14c = local_7d0._4_4_;
            local_7d0._0_4_ = local_13c;
            in_stack_fffffffffffff670 = local_248[2];
            local_148 = local_14c;
            if (in_stack_fffffffffffff670 != 1) {
              if (in_stack_fffffffffffff670 == 2) {
                if (lVar1 < 0) {
                  iVar7 = local_14c + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  in_stack_fffffffffffff66c = -iVar7 / 2 + -1;
                  local_148 = in_stack_fffffffffffff66c;
                }
                else {
                  in_stack_fffffffffffff66c = local_14c / 2;
                  local_148 = in_stack_fffffffffffff66c;
                }
              }
              else if (in_stack_fffffffffffff670 == 4) {
                if (lVar1 < 0) {
                  iVar7 = local_14c + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  in_stack_fffffffffffff668 = -iVar7 / 4 + -1;
                  local_148 = in_stack_fffffffffffff668;
                }
                else {
                  in_stack_fffffffffffff668 = local_14c / 4;
                  local_148 = in_stack_fffffffffffff668;
                }
              }
              else if (lVar1 < 0) {
                iVar7 = local_14c + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                in_stack_fffffffffffff664 = -iVar7 / in_stack_fffffffffffff670 + -1;
                local_148 = in_stack_fffffffffffff664;
              }
              else {
                in_stack_fffffffffffff664 = local_14c / in_stack_fffffffffffff670;
                local_148 = in_stack_fffffffffffff664;
              }
            }
            local_7d0._4_4_ = local_148;
            local_1f0 = local_7d8 + 4;
            local_1f8 = &local_254;
            local_1c4 = 0;
            local_7d8._4_4_ = local_254.vect[0] + local_7d8._4_4_;
            local_1d4 = 1;
            iVar7 = local_7d0._4_4_;
            local_7d0._0_4_ = local_254.vect[1] + (CpOp)local_7d0;
            local_1e4 = 2;
            local_7d0._4_4_ = local_254.vect[2] + iVar7;
            local_7d8 = local_7d8;
            local_7d0 = local_7d0;
            local_1e0 = local_1f8;
            local_1d0 = local_1f8;
            local_1c0 = local_1f8;
            local_150 = in_stack_fffffffffffff670;
          }
        }
        amrex::MFIter::validbox
                  ((MFIter *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
        amrex::Box::operator&((Box *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
        bVar6 = amrex::Box::ok(&local_7c4);
        if (bVar6) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),
                     (MFIter *)in_stack_fffffffffffff620);
          local_808 = local_848;
          memcpy(local_8d8,local_808,0x3c);
          memcpy(auStack_898,local_708,0x3c);
          local_858[0] = local_444;
          local_858[1] = iStack_440;
          local_850 = local_43c;
          amrex::
          ParallelFor<Projection::putDown(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::FArrayBox*,int,int,amrex::Orientation_const*,int,int)::__0>
                    ((Box *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                     (anon_class_144_3_38154744 *)
                     CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
        }
        amrex::MFIter::operator++(&local_7a8);
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff620);
      ppMVar9 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                          ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                           in_stack_fffffffffffff620,(size_type)in_stack_fffffffffffff618);
      in_stack_fffffffffffff620 = &(*ppMVar9)->super_FabArray<amrex::FArrayBox>;
      amrex::Periodicity::NonPeriodic();
      amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                 (FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                 (Periodicity *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 in_stack_fffffffffffff63c);
      amrex::MultiFab::~MultiFab((MultiFab *)0x597c01);
      amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x597c0e);
      amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff620);
    }
  }
  return;
}

Assistant:

void
Projection::putDown (const Vector<MultiFab*>& phi,
                     FArrayBox*         phi_fine_strip,
                     int                c_lev,
                     int                f_lev,
                     const Orientation* outFaces,
                     int                numOutFlowFaces,
                     int                ncStripWidth)
{
    BL_PROFILE("Projection::putDown()");
    //
    // Put down to coarser levels.
    //
    const int nCompPhi = 1; // phi_fine_strip.nComp();
    const int nGrow    = 0; // phi_fine_strip.nGrow();
    IntVect ratio      = IntVect::TheUnitVector();

    for (int lev = f_lev-1; lev >= c_lev; lev--)
    {
        ratio *= parent->refRatio(lev);
        const Box& domainC = parent->Geom(lev).Domain();

        for (int iface = 0; iface < numOutFlowFaces; iface++)
        {
            Box phiC_strip =
                amrex::surroundingNodes(amrex::bdryNode(domainC, outFaces[iface], ncStripWidth));
            phiC_strip.grow(nGrow);
            BoxArray ba(phiC_strip);

            // FIXME: this size may need adjusting
            ba.maxSize(32);

            DistributionMapping dm{ba};
            MultiFab phi_crse_strip(ba, dm, nCompPhi, 0);
            phi_crse_strip.setVal(0);
            const auto& phi_f_arr = phi_fine_strip[iface].array();

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(phi_crse_strip); mfi.isValid(); ++mfi)
            {
                Box ovlp = amrex::coarsen(phi_fine_strip[iface].box(),ratio) & mfi.validbox();
                if (ovlp.ok())
                {
                    const auto& phi_c_arr = phi_crse_strip.array(mfi);
                    ParallelFor(ovlp, [phi_c_arr,phi_f_arr,ratio]
                    AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                    {
                       phi_c_arr(i,j,k) = phi_f_arr(i*ratio[0],j*ratio[1],k*ratio[2]);
                    });
                }
            }
            phi[lev]->ParallelCopy(phi_crse_strip);
        }
    }
}